

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetIF.hpp
# Opt level: O2

string * __thiscall
gmlc::netif::addressToString_abi_cxx11_
          (string *__return_storage_ptr__,netif *this,sockaddr *addr,int sa_len)

{
  ushort uVar1;
  long lStack_60;
  allocator<char> local_49;
  char addr_str [46];
  
  uVar1 = *(ushort *)this;
  if (uVar1 == 2) {
    lStack_60 = 4;
  }
  else {
    if (uVar1 != 10) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    lStack_60 = 8;
  }
  inet_ntop((uint)uVar1,this + lStack_60,addr_str,0x2e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,addr_str,&local_49);
  return __return_storage_ptr__;
}

Assistant:

inline std::string addressToString(struct sockaddr* addr, int sa_len)
    {
#if defined(__MINGW32__)
        char addr_str[NI_MAXHOST];
        if (getnameinfo(addr, sa_len, addr_str, NI_MAXHOST, 0, 0, NI_NUMERICHOST) != 0) {
            return std::string();
        }
#else
        (void)sa_len;
        int family = addr->sa_family;
        char addr_str[INET6_ADDRSTRLEN];
        void* src_addr = nullptr;
        switch (family) {
            case AF_INET:
                src_addr = &(reinterpret_cast<struct sockaddr_in*>(addr)->sin_addr);
                break;
            case AF_INET6:
                src_addr = &(reinterpret_cast<struct sockaddr_in6*>(addr)->sin6_addr);
                break;
            default:  // Invalid address type for conversion to text
                return std::string();
        }
        inet_ntop(family, src_addr, addr_str, INET6_ADDRSTRLEN);
#endif

        return std::string(addr_str);
    }